

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  CycleState *value;
  TrackerBase *pTVar1;
  pointer psVar2;
  TrackerContext *pTVar3;
  int iVar4;
  ReusableStringStream *pRVar5;
  long lVar6;
  long lVar7;
  pointer psVar8;
  ReusableStringStream RStack_78;
  string local_60;
  SourceLineInfo local_40;
  
  while (pTVar1 = (TrackerBase *)this->m_ctx->m_currentTracker, pTVar1 != this) {
    (*(pTVar1->super_ITracker)._vptr_ITracker[8])();
  }
  value = &this->m_runState;
  switch(this->m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    ReusableStringStream::ReusableStringStream(&RStack_78);
    local_40.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Toxe[P]catch2-examples/src/single_header/multiple_test_files/include/catch2/catch.hpp"
    ;
    local_40.line = 0x3887;
    Catch::operator<<(RStack_78.m_oss,&local_40);
    std::operator<<(RStack_78.m_oss,": Internal Catch2 error: ");
    std::operator<<(RStack_78.m_oss,"Illogical state: ");
    pRVar5 = ReusableStringStream::operator<<(&RStack_78,value);
    ReusableStringStream::str_abi_cxx11_(&local_60,pRVar5);
    throw_logic_error(&local_60);
  case Executing:
    goto switchD_0011e9b4_caseD_1;
  case ExecutingChildren:
    psVar8 = (this->m_children).
             super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar2 = (this->m_children).
             super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)psVar2 - (long)psVar8;
    for (lVar6 = lVar7 >> 6; 0 < lVar6; lVar6 = lVar6 + -1) {
      iVar4 = (*((psVar8->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 == '\0') goto LAB_0011ea71;
      iVar4 = (*(psVar8[1].
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 == '\0') {
        psVar8 = psVar8 + 1;
        goto LAB_0011ea71;
      }
      iVar4 = (*(psVar8[2].
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 == '\0') {
        psVar8 = psVar8 + 2;
        goto LAB_0011ea71;
      }
      iVar4 = (*(psVar8[3].
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 == '\0') {
        psVar8 = psVar8 + 3;
        goto LAB_0011ea71;
      }
      psVar8 = psVar8 + 4;
      lVar7 = lVar7 + -0x40;
    }
    lVar7 = lVar7 >> 4;
    if (lVar7 == 1) {
LAB_0011ea50:
      iVar4 = (*((psVar8->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 != '\0') {
        psVar8 = psVar2;
      }
    }
    else if (lVar7 == 2) {
LAB_0011ea3f:
      iVar4 = (*((psVar8->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 != '\0') {
        psVar8 = psVar8 + 1;
        goto LAB_0011ea50;
      }
    }
    else {
      if (lVar7 != 3) goto switchD_0011e9b4_caseD_1;
      iVar4 = (*((psVar8->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      if ((char)iVar4 != '\0') {
        psVar8 = psVar8 + 1;
        goto LAB_0011ea3f;
      }
    }
LAB_0011ea71:
    if (psVar8 != psVar2) goto switchD_0011e9b4_caseD_3;
switchD_0011e9b4_caseD_1:
    *value = CompletedSuccessfully;
switchD_0011e9b4_caseD_3:
    moveToParent(this);
    pTVar3 = this->m_ctx;
    pTVar3->m_runState = CompletedCycle;
    return (int)pTVar3;
  case NeedsAnotherRun:
    goto switchD_0011e9b4_caseD_3;
  default:
    ReusableStringStream::ReusableStringStream(&RStack_78);
    local_40.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Toxe[P]catch2-examples/src/single_header/multiple_test_files/include/catch2/catch.hpp"
    ;
    local_40.line = 0x388a;
    Catch::operator<<(RStack_78.m_oss,&local_40);
    std::operator<<(RStack_78.m_oss,": Internal Catch2 error: ");
    std::operator<<(RStack_78.m_oss,"Unknown state: ");
    pRVar5 = ReusableStringStream::operator<<(&RStack_78,value);
    ReusableStringStream::str_abi_cxx11_(&local_60,pRVar5);
    throw_logic_error(&local_60);
  }
}

Assistant:

void TrackerBase::close() {

        // Close any still open children (e.g. generators)
        while( &m_ctx.currentTracker() != this )
            m_ctx.currentTracker().close();

        switch( m_runState ) {
            case NeedsAnotherRun:
                break;

            case Executing:
                m_runState = CompletedSuccessfully;
                break;
            case ExecutingChildren:
                if( std::all_of(m_children.begin(), m_children.end(), [](ITrackerPtr const& t){ return t->isComplete(); }) )
                    m_runState = CompletedSuccessfully;
                break;

            case NotStarted:
            case CompletedSuccessfully:
            case Failed:
                CATCH_INTERNAL_ERROR( "Illogical state: " << m_runState );

            default:
                CATCH_INTERNAL_ERROR( "Unknown state: " << m_runState );
        }
        moveToParent();
        m_ctx.completeCycle();
    }